

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Pseudo * linearize_function_expr(Proc *proc,AstNode *expr)

{
  Proc *pPVar1;
  LinearizerState *linearizer;
  C_MemoryAllocator *pCVar2;
  Proc *pPVar3;
  Pseudo *pseudo;
  Pseudo *pPVar4;
  Instruction *insn;
  
  pPVar1 = proc->linearizer->current_proc;
  pPVar3 = allocate_proc(proc->linearizer,expr);
  linearizer = proc->linearizer;
  linearizer->current_proc = pPVar3;
  linearize_function(linearizer);
  proc->linearizer->current_proc = pPVar1;
  pseudo = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
  pCVar2 = pPVar3->linearizer->compiler_state->allocator;
  pPVar4 = (Pseudo *)(*pCVar2->calloc)(pCVar2->arena,1,0x30);
  *(uint *)pPVar4 = *(uint *)pPVar4 & 0xfffffff0 | 6;
  (pPVar4->field_3).proc = pPVar3;
  insn = allocate_instruction(proc,op_closure,expr->line_number);
  pPVar4 = add_instruction_operand(proc,insn,pPVar4);
  add_instruction_target(proc,insn,pseudo);
  add_instruction(proc,insn);
  if (pPVar4 != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pPVar4,false);
  }
  return pseudo;
}

Assistant:

static Pseudo *linearize_function_expr(Proc *proc, AstNode *expr)
{
	Proc *curproc = proc->linearizer->current_proc;
	Proc *newproc = allocate_proc(proc->linearizer, expr);
	set_current_proc(proc->linearizer, newproc);
	linearize_function(proc->linearizer);
	set_current_proc(proc->linearizer, curproc); // restore the proc
	ravitype_t target_type = expr->function_expr.type.type_code;
	Pseudo *target = allocate_temp_pseudo(proc, target_type, true);
	Pseudo *operand = allocate_closure_pseudo(newproc);
	Instruction *insn = allocate_instruction(proc, op_closure, expr->line_number);
	Pseudo *tofree = add_instruction_operand(proc, insn, operand);
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
	return target;
}